

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_version_details.c
# Opt level: O0

char * archive_version_details(void)

{
  char *p_00;
  char *p_01;
  char *__s;
  char *p_02;
  char *p_03;
  char *p_04;
  char *p_05;
  char *p_06;
  char *p_07;
  char *p_08;
  size_t sVar1;
  char *local_68;
  char *sep;
  char *p;
  char *libattr;
  char *librichacl;
  char *libacl;
  char *libiconv;
  char *liblzo;
  char *libzstd;
  char *liblz4;
  char *bzlib;
  char *liblzma;
  char *zlib;
  
  p_00 = archive_zlib_version();
  p_01 = archive_liblzma_version();
  __s = archive_bzlib_version();
  p_02 = archive_liblz4_version();
  p_03 = archive_libzstd_version();
  p_04 = archive_liblzo2_version();
  p_05 = archive_libiconv_version();
  p_06 = archive_libacl_version();
  p_07 = archive_librichacl_version();
  p_08 = archive_libacl_version();
  if (archive_version_details::init == 0) {
    archive_version_details::str.s = (char *)0x0;
    archive_version_details::str.length = 0;
    archive_version_details::str.buffer_length = 0;
    archive_strcat(&archive_version_details::str,"libarchive 3.8.0dev");
    if (p_00 != (char *)0x0) {
      archive_strcat(&archive_version_details::str," zlib/");
      archive_strcat(&archive_version_details::str,p_00);
    }
    if (p_01 != (char *)0x0) {
      archive_strcat(&archive_version_details::str," liblzma/");
      archive_strcat(&archive_version_details::str,p_01);
    }
    if (__s != (char *)0x0) {
      local_68 = strchr(__s,0x2c);
      if (local_68 == (char *)0x0) {
        sVar1 = strlen(__s);
        local_68 = __s + sVar1;
      }
      archive_strcat(&archive_version_details::str," bz2lib/");
      archive_strncat(&archive_version_details::str,__s,(long)local_68 - (long)__s);
    }
    if (p_02 != (char *)0x0) {
      archive_strcat(&archive_version_details::str," liblz4/");
      archive_strcat(&archive_version_details::str,p_02);
    }
    if (p_03 != (char *)0x0) {
      archive_strcat(&archive_version_details::str," libzstd/");
      archive_strcat(&archive_version_details::str,p_03);
    }
    if (p_04 != (char *)0x0) {
      archive_strcat(&archive_version_details::str," liblzo2/");
      archive_strcat(&archive_version_details::str,p_04);
    }
    archive_xml_version(&archive_version_details::str);
    archive_regex_version(&archive_version_details::str);
    archive_crypto_version(&archive_version_details::str);
    archive_libb2_version(&archive_version_details::str);
    if (p_07 != (char *)0x0) {
      archive_strcat(&archive_version_details::str," librichacl/");
      archive_strcat(&archive_version_details::str,p_07);
    }
    if (p_06 != (char *)0x0) {
      archive_strcat(&archive_version_details::str," libacl/");
      archive_strcat(&archive_version_details::str,p_06);
    }
    if (p_08 != (char *)0x0) {
      archive_strcat(&archive_version_details::str," libattr/");
      archive_strcat(&archive_version_details::str,p_08);
    }
    if (p_05 != (char *)0x0) {
      archive_strcat(&archive_version_details::str," libiconv/");
      archive_strcat(&archive_version_details::str,p_05);
    }
  }
  return archive_version_details::str.s;
}

Assistant:

const char *
archive_version_details(void)
{
	static struct archive_string str;
	static int init = 0;
	const char *zlib = archive_zlib_version();
	const char *liblzma = archive_liblzma_version();
	const char *bzlib = archive_bzlib_version();
	const char *liblz4 = archive_liblz4_version();
	const char *libzstd = archive_libzstd_version();
	const char *liblzo = archive_liblzo2_version();
	const char *libiconv = archive_libiconv_version();
	const char *libacl = archive_libacl_version();
	const char *librichacl = archive_librichacl_version();
	const char *libattr = archive_libacl_version();

	if (!init) {
		archive_string_init(&str);

		archive_strcat(&str, ARCHIVE_VERSION_STRING);
		if (zlib) {
			archive_strcat(&str, " zlib/");
			archive_strcat(&str, zlib);
		}
		if (liblzma) {
			archive_strcat(&str, " liblzma/");
			archive_strcat(&str, liblzma);
		}
		if (bzlib) {
			const char *p = bzlib;
			const char *sep = strchr(p, ',');
			if (sep == NULL)
				sep = p + strlen(p);
			archive_strcat(&str, " bz2lib/");
			archive_strncat(&str, p, sep - p);
		}
		if (liblz4) {
			archive_strcat(&str, " liblz4/");
			archive_strcat(&str, liblz4);
		}
		if (libzstd) {
			archive_strcat(&str, " libzstd/");
			archive_strcat(&str, libzstd);
		}
		if (liblzo) {
			archive_strcat(&str, " liblzo2/");
			archive_strcat(&str, liblzo);
		}
		archive_xml_version(&str);
		archive_regex_version(&str);
		archive_crypto_version(&str);
		archive_libb2_version(&str);
		if (librichacl) {
			archive_strcat(&str, " librichacl/");
			archive_strcat(&str, librichacl);
		}
		if (libacl) {
			archive_strcat(&str, " libacl/");
			archive_strcat(&str, libacl);
		}
		if (libattr) {
			archive_strcat(&str, " libattr/");
			archive_strcat(&str, libattr);
		}
		if (libiconv) {
			archive_strcat(&str, " libiconv/");
			archive_strcat(&str, libiconv);
		}
	}
	return str.s;
}